

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O2

void __thiscall
vkt::tessellation::anon_unknown_2::PassthroughTestInstance::PassthroughTestInstance
          (PassthroughTestInstance *this,Context *context,Params *params)

{
  string *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined3 uVar5;
  float fVar6;
  bool bVar7;
  long lStack_70;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__PassthroughTestInstance_00bdbd08;
  uVar5 = *(undefined3 *)&params->field_0x1;
  fVar6 = (params->tessLevels).inner[0];
  uVar1 = *(undefined8 *)((params->tessLevels).inner + 1);
  uVar2 = *(undefined8 *)((params->tessLevels).outer + 1);
  uVar3 = *(undefined8 *)((params->tessLevels).outer + 3);
  (this->m_params).useTessLevels = params->useTessLevels;
  *(undefined3 *)&(this->m_params).field_0x1 = uVar5;
  (this->m_params).tessLevels.inner[0] = fVar6;
  *(undefined8 *)((this->m_params).tessLevels.inner + 1) = uVar1;
  *(undefined8 *)((this->m_params).tessLevels.outer + 1) = uVar2;
  *(undefined8 *)((this->m_params).tessLevels.outer + 3) = uVar3;
  (this->m_params).inputPatchVertices = params->inputPatchVertices;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&(this->m_params).vertices,&params->vertices);
  bVar7 = false;
  lStack_70 = 0;
  do {
    this_00 = &(this->m_params).pipelineCases[lStack_70].tessEvalShaderName;
    *(undefined2 *)((long)(this_00 + -1) + 0x18) =
         *(undefined2 *)(params->pipelineCases + lStack_70);
    std::__cxx11::string::string
              ((string *)this_00,(string *)&params->pipelineCases[lStack_70].tessEvalShaderName);
    std::__cxx11::string::string
              ((string *)&(this->m_params).pipelineCases[lStack_70].geomShaderName,
               (string *)&params->pipelineCases[lStack_70].geomShaderName);
    std::__cxx11::string::string
              ((string *)&(this->m_params).pipelineCases[lStack_70].description,
               (string *)&params->pipelineCases[lStack_70].description);
    lStack_70 = 1;
    bVar4 = !bVar7;
    bVar7 = true;
  } while (bVar4);
  std::__cxx11::string::string((string *)&(this->m_params).message,(string *)&params->message);
  return;
}

Assistant:

PassthroughTestInstance	(Context& context, const Params& params) : TestInstance(context), m_params(params) {}